

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLECPublicKey.cpp
# Opt level: O2

unsigned_long __thiscall OSSLECPublicKey::getOrderLength(OSSLECPublicKey *this)

{
  int iVar1;
  EC_GROUP *group;
  BIGNUM *order;
  unsigned_long uVar2;
  
  group = EC_KEY_get0_group((EC_KEY *)this->eckey);
  if ((group != (EC_GROUP *)0x0) && (order = BN_new(), order != (BIGNUM *)0x0)) {
    uVar2 = 0;
    iVar1 = EC_GROUP_get_order(group,order,(BN_CTX *)0x0);
    if (iVar1 != 0) {
      iVar1 = BN_num_bits(order);
      uVar2 = (unsigned_long)((iVar1 + 7) / 8);
    }
    BN_clear_free(order);
    return uVar2;
  }
  return 0;
}

Assistant:

unsigned long OSSLECPublicKey::getOrderLength() const
{
	const EC_GROUP* grp = EC_KEY_get0_group(eckey);
	if (grp != NULL)
	{
		BIGNUM* order = BN_new();
		if (order == NULL)
			return 0;
		if (!EC_GROUP_get_order(grp, order, NULL))
		{
			BN_clear_free(order);
			return 0;
		}
		unsigned long len = BN_num_bytes(order);
		BN_clear_free(order);
		return len;
	}
	return 0;
}